

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O1

StatusOr<int>
google::protobuf::json_internal::Proto2Descriptor::EnumNumberByName
          (Field f,string_view name,bool case_insensitive)

{
  bool bVar1;
  string_view name_00;
  char cVar2;
  EnumDescriptor *pEVar3;
  EnumValueDescriptor *pEVar4;
  undefined7 in_register_00000009;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  int index;
  FieldDescriptor *this;
  int in_R8D;
  StatusOr<int> SVar6;
  Status local_70;
  char *local_68;
  char *local_60;
  long *local_58;
  undefined8 local_50;
  long local_48 [2];
  char **local_38;
  code *local_30;
  
  local_60 = (char *)CONCAT71(in_register_00000009,case_insensitive);
  local_68 = name._M_str;
  this = (FieldDescriptor *)name._M_len;
  pEVar3 = FieldDescriptor::enum_type(this);
  if (in_R8D == 0) {
    name_00._M_str = local_60;
    name_00._M_len = (size_t)local_68;
    pEVar4 = EnumDescriptor::FindValueByName(pEVar3,name_00);
    if (pEVar4 != (EnumValueDescriptor *)0x0) {
      *(int *)&f->all_names_ = pEVar4->number_;
      f->super_SymbolBase = '\x01';
      f->field_0x1 = 0;
      f->type_ = '\0';
      f->field_0x3 = 0;
      f->number_ = 0;
      uVar5 = extraout_RDX_03;
      goto LAB_002d0f41;
    }
    local_38 = &local_68;
    local_30 = absl::lts_20240722::str_format_internal::FormatArgImpl::
               Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
    absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
              (&local_58,"unknown enum value: \'%s\'",0x18,&local_38,1);
    absl::lts_20240722::InvalidArgumentError(&local_70,local_50,local_58);
    absl::lts_20240722::internal_statusor::StatusOrData<int>::
    StatusOrData<absl::lts_20240722::Status,_0>((StatusOrData<int> *)f,&local_70);
    uVar5 = extraout_RDX_04;
    if ((local_70.rep_ & 1) == 0) {
      absl::lts_20240722::status_internal::StatusRep::Unref();
      uVar5 = extraout_RDX_05;
    }
  }
  else {
    bVar1 = 0 < pEVar3->value_count_;
    if (0 < pEVar3->value_count_) {
      pEVar3 = FieldDescriptor::enum_type(this);
      pEVar4 = EnumDescriptor::value(pEVar3,0);
      cVar2 = absl::lts_20240722::EqualsIgnoreCase
                        (local_68,local_60,pEVar4->all_names_->_M_string_length,
                         (pEVar4->all_names_->_M_dataplus)._M_p);
      uVar5 = extraout_RDX;
      if (cVar2 == '\0') {
        index = 1;
        do {
          pEVar3 = FieldDescriptor::enum_type(this);
          bVar1 = index < pEVar3->value_count_;
          if (pEVar3->value_count_ <= index) goto LAB_002d0e2a;
          pEVar3 = FieldDescriptor::enum_type(this);
          pEVar4 = EnumDescriptor::value(pEVar3,index);
          cVar2 = absl::lts_20240722::EqualsIgnoreCase
                            (local_68,local_60,pEVar4->all_names_->_M_string_length,
                             (pEVar4->all_names_->_M_dataplus)._M_p);
          index = index + 1;
          uVar5 = extraout_RDX_00;
        } while (cVar2 == '\0');
      }
      *(int *)&f->all_names_ = pEVar4->number_;
      f->super_SymbolBase = '\x01';
      f->field_0x1 = 0;
      f->type_ = '\0';
      f->field_0x3 = 0;
      f->number_ = 0;
      if (bVar1) goto LAB_002d0f41;
    }
LAB_002d0e2a:
    local_38 = &local_68;
    local_30 = absl::lts_20240722::str_format_internal::FormatArgImpl::
               Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
    absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
              (&local_58,"unknown enum value: \'%s\'",0x18,&local_38,1);
    absl::lts_20240722::InvalidArgumentError(&local_70,local_50,local_58);
    absl::lts_20240722::internal_statusor::StatusOrData<int>::
    StatusOrData<absl::lts_20240722::Status,_0>((StatusOrData<int> *)f,&local_70);
    uVar5 = extraout_RDX_01;
    if ((local_70.rep_ & 1) == 0) {
      absl::lts_20240722::status_internal::StatusRep::Unref();
      uVar5 = extraout_RDX_02;
    }
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
    uVar5 = extraout_RDX_06;
  }
LAB_002d0f41:
  SVar6.super_StatusOrData<int>._8_8_ = uVar5;
  SVar6.super_StatusOrData<int>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)f;
  return (StatusOr<int>)SVar6.super_StatusOrData<int>;
}

Assistant:

static absl::StatusOr<int32_t> EnumNumberByName(Field f,
                                                  absl::string_view name,
                                                  bool case_insensitive) {
    if (case_insensitive) {
      for (int i = 0; i < f->enum_type()->value_count(); ++i) {
        const auto* ev = f->enum_type()->value(i);
        if (absl::EqualsIgnoreCase(name, ev->name())) {
          return ev->number();
        }
      }
      return absl::InvalidArgumentError(
          absl::StrFormat("unknown enum value: '%s'", name));
    }

    if (const auto* ev = f->enum_type()->FindValueByName(name)) {
      return ev->number();
    }

    return absl::InvalidArgumentError(
        absl::StrFormat("unknown enum value: '%s'", name));
  }